

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.hh
# Opt level: O2

void __thiscall Pl_ASCIIHexDecoder::~Pl_ASCIIHexDecoder(Pl_ASCIIHexDecoder *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x48);
  return;
}

Assistant:

~Pl_ASCIIHexDecoder() final = default;